

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O3

void aom_dc_top_predictor_64x32_avx2(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  undefined1 auVar1 [32];
  int iVar2;
  undefined1 (*pauVar3) [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  
  auVar4 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
  auVar5 = vpsadbw_avx2(auVar4,*(undefined1 (*) [32])above);
  auVar1 = vpsadbw_avx2(auVar4,*(undefined1 (*) [32])(above + 0x20));
  auVar5 = vpaddq_avx2(auVar1,auVar5);
  auVar1 = vpermq_avx2(auVar5,0x4e);
  auVar5 = vpaddq_avx2(auVar1,auVar5);
  auVar1 = vpshufd_avx2(auVar5,0xee);
  auVar6._8_2_ = 0x20;
  auVar6._0_8_ = 0x20002000200020;
  auVar6._10_2_ = 0x20;
  auVar6._12_2_ = 0x20;
  auVar6._14_2_ = 0x20;
  auVar6._16_2_ = 0x20;
  auVar6._18_2_ = 0x20;
  auVar6._20_2_ = 0x20;
  auVar6._22_2_ = 0x20;
  auVar6._24_2_ = 0x20;
  auVar6._26_2_ = 0x20;
  auVar6._28_2_ = 0x20;
  auVar6._30_2_ = 0x20;
  auVar5 = vpaddw_avx2(auVar5,auVar6);
  auVar5 = vpaddw_avx2(auVar5,auVar1);
  auVar5 = vpsrlw_avx2(auVar5,6);
  auVar5 = vpshufb_avx2(auVar5,auVar4);
  pauVar3 = (undefined1 (*) [32])(dst + 0x20);
  iVar2 = 0x20;
  do {
    pauVar3[-1] = auVar5;
    *pauVar3 = auVar5;
    pauVar3 = (undefined1 (*) [32])(*pauVar3 + stride);
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  return;
}

Assistant:

static inline __m256i dc_sum_64(const uint8_t *ref) {
  const __m256i x0 = _mm256_loadu_si256((const __m256i *)ref);
  const __m256i x1 = _mm256_loadu_si256((const __m256i *)(ref + 32));
  const __m256i zero = _mm256_setzero_si256();
  __m256i y0 = _mm256_sad_epu8(x0, zero);
  __m256i y1 = _mm256_sad_epu8(x1, zero);
  y0 = _mm256_add_epi64(y0, y1);
  __m256i u0 = _mm256_permute2x128_si256(y0, y0, 1);
  y0 = _mm256_add_epi64(u0, y0);
  u0 = _mm256_unpackhi_epi64(y0, y0);
  return _mm256_add_epi16(y0, u0);
}